

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out,bool metacolon)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_00;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_01;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_02;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_03;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_04;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_05;
  int iVar4;
  const_reference pvVar5;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  tmp;
  
LAB_00134d98:
  do {
    pcVar3 = cur->_M_current;
    if (pcVar3 == end._M_current) {
LAB_00134f19:
      __return_storage_ptr__->next_ = out.next_;
      __return_storage_ptr__->rest_ = out.rest_;
      (__return_storage_ptr__->out_).container =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(out.out_.container._4_4_,out.out_.container._0_4_);
      __return_storage_ptr__->traits_ =
           (traits<char> *)CONCAT44(out.traits_._4_4_,out.traits_._0_4_);
      return __return_storage_ptr__;
    }
    cVar2 = *pcVar3;
    if (cVar2 != '$') {
      if (cVar2 == '(') {
        cur->_M_current = pcVar3 + 1;
        out_00.rest_ = out.rest_;
        out_00.next_ = out.next_;
        out_00.out_.container._4_4_ = out.out_.container._4_4_;
        out_00.out_.container._0_4_ = out.out_.container._0_4_;
        out_00.traits_._4_4_ = out.traits_._4_4_;
        out_00.traits_._0_4_ = out.traits_._0_4_;
        format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (&tmp,this,cur,end,out_00,false);
        out.next_ = tmp.next_;
        out.rest_ = tmp.rest_;
        out.out_.container._0_4_ = SUB84(tmp.out_.container,0);
        out.out_.container._4_4_ = (undefined4)((ulong)tmp.out_.container >> 0x20);
        out.traits_._0_4_ = SUB84(tmp.traits_,0);
        out.traits_._4_4_ = (undefined4)((ulong)tmp.traits_ >> 0x20);
        detail::ensure_(cur->_M_current[-1] == ')',error_paren,
                        "unbalanced parentheses in format string",
                        "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                        ,0x43b);
      }
      else {
        if (cVar2 == ':') {
          if (metacolon) {
LAB_00134f13:
            cur->_M_current = pcVar3 + 1;
            goto LAB_00134f19;
          }
        }
        else {
          if (cVar2 == '\\') {
            pcVar1 = pcVar3 + 1;
            cur->_M_current = pcVar1;
            if ((pcVar1 == end._M_current) || (*pcVar1 != 'g')) {
              out_03.rest_ = out.rest_;
              out_03.next_ = out.next_;
              out_03.out_.container._4_4_ = out.out_.container._4_4_;
              out_03.out_.container._0_4_ = out.out_.container._0_4_;
              out_03.traits_._4_4_ = out.traits_._4_4_;
              out_03.traits_._0_4_ = out.traits_._0_4_;
              format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        (&tmp,this,cur,end,out_03);
            }
            else {
              cur->_M_current = pcVar3 + 2;
              out_02.rest_ = out.rest_;
              out_02.next_ = out.next_;
              out_02.out_.container._4_4_ = out.out_.container._4_4_;
              out_02.out_.container._0_4_ = out.out_.container._0_4_;
              out_02.traits_._4_4_ = out.traits_._4_4_;
              out_02.traits_._0_4_ = out.traits_._0_4_;
              format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        (&tmp,this,cur,end,out_02);
            }
            goto LAB_00134efd;
          }
          if (cVar2 == ')') goto LAB_00134f13;
          if (cVar2 == '?') {
            cur->_M_current = pcVar3 + 1;
            detail::ensure_(pcVar3 + 1 != end._M_current,error_subreg,
                            "malformed conditional in format string",
                            "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                            ,0x440);
            iVar4 = detail::
                    toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                              (cur,end,*(traits<char> **)(this + 0x80),10,*(int *)(this + 8) + -1);
            detail::ensure_(iVar4 != 0,error_subreg,"invalid back-reference",
                            "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                            ,0x443);
            pvVar5 = detail::
                     sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(this + 8),(long)iVar4);
            if (pvVar5->matched == true) {
              out_04.rest_ = out.rest_;
              out_04.next_ = out.next_;
              out_04.out_.container._4_4_ = out.out_.container._4_4_;
              out_04.out_.container._0_4_ = out.out_.container._0_4_;
              out_04.traits_._4_4_ = out.traits_._4_4_;
              out_04.traits_._0_4_ = out.traits_._0_4_;
              format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        (&tmp,this,cur,end,out_04,true);
              out.next_ = tmp.next_;
              out.rest_ = tmp.rest_;
              out.out_.container._0_4_ = tmp.out_.container._0_4_;
              out.out_.container._4_4_ = tmp.out_.container._4_4_;
              out.traits_._0_4_ = tmp.traits_._0_4_;
              out.traits_._4_4_ = tmp.traits_._4_4_;
              if (cur->_M_current[-1] == ':') {
                format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                          (this,cur,end._M_current,0);
              }
            }
            else {
              format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                        (this,cur,end._M_current,1);
              if (cur->_M_current[-1] == ':') {
                out_05.rest_ = out.rest_;
                out_05.next_ = out.next_;
                out_05.out_.container._4_4_ = out.out_.container._4_4_;
                out_05.out_.container._0_4_ = out.out_.container._0_4_;
                out_05.traits_._4_4_ = out.traits_._4_4_;
                out_05.traits_._0_4_ = out.traits_._0_4_;
                format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                          (&tmp,this,cur,end,out_05,false);
                out.next_ = tmp.next_;
                out.rest_ = tmp.rest_;
                out.out_.container._0_4_ = SUB84(tmp.out_.container,0);
                out.out_.container._4_4_ = (undefined4)((ulong)tmp.out_.container >> 0x20);
                out.traits_._0_4_ = SUB84(tmp.traits_,0);
                out.traits_._4_4_ = (undefined4)((ulong)tmp.traits_ >> 0x20);
              }
            }
            goto LAB_00134f19;
          }
        }
        cur->_M_current = pcVar3 + 1;
        tmp.rest_ = out.rest_;
        tmp.next_ = out.next_;
        tmp.out_.container =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(out.out_.container._4_4_,out.out_.container._0_4_);
        tmp.traits_ = (traits<char> *)CONCAT44(out.traits_._4_4_,out.traits_._0_4_);
        out.next_ = op_none;
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=(&tmp,*pcVar3);
      }
      goto LAB_00134d98;
    }
    cur->_M_current = pcVar3 + 1;
    out_01.rest_ = out.rest_;
    out_01.next_ = out.next_;
    out_01.out_.container._4_4_ = out.out_.container._4_4_;
    out_01.out_.container._0_4_ = out.out_.container._0_4_;
    out_01.traits_._4_4_ = out.traits_._4_4_;
    out_01.traits_._0_4_ = out.traits_._0_4_;
    format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
              (&tmp,this,cur,end,out_01);
LAB_00134efd:
    out.next_ = tmp.next_;
    out.rest_ = tmp.rest_;
    out.out_.container._0_4_ = SUB84(tmp.out_.container,0);
    out.out_.container._4_4_ = (undefined4)((ulong)tmp.out_.container >> 0x20);
    out.traits_._0_4_ = SUB84(tmp.traits_,0);
    out.traits_._4_4_ = (undefined4)((ulong)tmp.traits_ >> 0x20);
  } while( true );
}

Assistant:

OutputIterator format_all_impl_(ForwardIterator &cur, ForwardIterator end, OutputIterator out, bool metacolon = false) const
    {
        int max = 0, sub = 0;
        detail::noop_output_iterator<char_type> noop;

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    out = this->format_named_backref_(++cur, end, out);
                }
                else
                {
                    out = this->format_escape_(cur, end, out);
                }
                break;

            case BOOST_XPR_CHAR_(char_type, '('):
                out = this->format_all_impl_(++cur, end, out);
                BOOST_XPR_ENSURE_(BOOST_XPR_CHAR_(char_type, ')') == *(cur-1)
                  , regex_constants::error_paren, "unbalanced parentheses in format string");
                break;

            case BOOST_XPR_CHAR_(char_type, '?'):
                BOOST_XPR_ENSURE_(++cur != end
                  , regex_constants::error_subreg, "malformed conditional in format string");
                max = static_cast<int>(this->size() - 1);
                sub = detail::toi(cur, end, *this->traits_, 10, max);
                BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
                if(this->sub_matches_[ sub ].matched)
                {
                    out = this->format_all_impl_(cur, end, out, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        this->format_all_impl_(cur, end, noop);
                }
                else
                {
                    this->format_all_impl_(cur, end, noop, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        out = this->format_all_impl_(cur, end, out);
                }
                return out;

            case BOOST_XPR_CHAR_(char_type, ':'):
                if(metacolon)
                {
                    BOOST_FALLTHROUGH;
            case BOOST_XPR_CHAR_(char_type, ')'):
                    ++cur;
                    return out;
                }
                BOOST_FALLTHROUGH;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }